

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

int __thiscall
cmExtraCodeBlocksGenerator::GetCBTargetType
          (cmExtraCodeBlocksGenerator *this,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *config;
  uint uVar3;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  switch(TVar2) {
  case EXECUTABLE:
    this_00 = target->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CMAKE_BUILD_TYPE",&local_61);
    config = cmMakefile::GetSafeDefinition(this_00,&local_40);
    bVar1 = cmGeneratorTarget::IsWin32Executable(target,config);
    uVar3 = 0;
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"MACOSX_BUNDLE",&local_62);
      bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      uVar3 = (uint)!bVar1;
    }
    std::__cxx11::string::~string((string *)&local_40);
    break;
  case STATIC_LIBRARY:
  case OBJECT_LIBRARY:
    uVar3 = 2;
    break;
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    uVar3 = 3;
    break;
  default:
    uVar3 = 4;
  }
  return uVar3;
}

Assistant:

int cmExtraCodeBlocksGenerator::GetCBTargetType(cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      if ((target->IsWin32Executable(
            target->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"))) ||
          (target->GetPropertyAsBool("MACOSX_BUNDLE"))) {
        return 0;
      }
      return 1;
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return 2;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      return 3;
    default:
      return 4;
  }
}